

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O0

boolean decode_mcu_AC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  int *piVar3;
  JBLOCKROW paJVar4;
  int iVar5;
  int iVar6;
  int *natural_order;
  uint local_48;
  int m;
  int v;
  int k;
  int sign;
  int tbl;
  uchar *st;
  JBLOCKROW block;
  arith_entropy_ptr_conflict entropy;
  JBLOCKROW *MCU_data_local;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)((long)&pjVar2[4].start_pass + 4) == 0) {
      process_restart(cinfo);
    }
    *(int *)((long)&pjVar2[4].start_pass + 4) = *(int *)((long)&pjVar2[4].start_pass + 4) + -1;
  }
  if (*(int *)&pjVar2[2].start_pass != -1) {
    piVar3 = cinfo->natural_order;
    paJVar4 = *MCU_data;
    iVar1 = cinfo->cur_comp_info[0]->ac_tbl_no;
    for (m = cinfo->Ss; m <= cinfo->Se; m = m + 1) {
      _sign = (&pjVar2[0xc].decode_mcu)[iVar1] + (m + -1) * 3;
      iVar5 = arith_decode(cinfo,(uchar *)_sign);
      if (iVar5 != 0) {
        return 1;
      }
      while (iVar5 = arith_decode(cinfo,(uchar *)(_sign + 1)), iVar5 == 0) {
        _sign = _sign + 3;
        m = m + 1;
        if (cinfo->Se < m) {
          cinfo->err->msg_code = 0x75;
          (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
          *(undefined4 *)&pjVar2[2].start_pass = 0xffffffff;
          return 1;
        }
      }
      iVar5 = arith_decode(cinfo,(uchar *)&pjVar2[0x14].decode_mcu);
      _sign = _sign + 2;
      natural_order._4_4_ = arith_decode(cinfo,(uchar *)_sign);
      if ((natural_order._4_4_ != 0) && (iVar6 = arith_decode(cinfo,(uchar *)_sign), iVar6 != 0)) {
        natural_order._4_4_ = natural_order._4_4_ << 1;
        iVar6 = 0xd9;
        if (m <= (int)(uint)cinfo->arith_ac_K[iVar1]) {
          iVar6 = 0xbd;
        }
        _sign = (&pjVar2[0xc].decode_mcu)[iVar1] + iVar6;
        while (iVar6 = arith_decode(cinfo,(uchar *)_sign), iVar6 != 0) {
          natural_order._4_4_ = natural_order._4_4_ << 1;
          if (natural_order._4_4_ == 0x8000) {
            cinfo->err->msg_code = 0x75;
            (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
            *(undefined4 *)&pjVar2[2].start_pass = 0xffffffff;
            return 1;
          }
          _sign = _sign + 1;
        }
      }
      local_48 = natural_order._4_4_;
      while (natural_order._4_4_ = (int)natural_order._4_4_ >> 1, natural_order._4_4_ != 0) {
        iVar6 = arith_decode(cinfo,(uchar *)(_sign + 0xe));
        if (iVar6 != 0) {
          local_48 = natural_order._4_4_ | local_48;
        }
      }
      local_48 = local_48 + 1;
      if (iVar5 != 0) {
        local_48 = -local_48;
      }
      (*paJVar4)[piVar3[m]] = (JCOEF)(local_48 << ((byte)cinfo->Al & 0x1f));
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_first (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{   
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int s, k, r;
  unsigned int EOBRUN;
  int Se, Al;
  const int * natural_order;
  JBLOCKROW block;
  BITREAD_STATE_VARS;
  d_derived_tbl * tbl;

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (! process_restart(cinfo))
	return FALSE;
  }

  /* If we've run out of data, just leave the MCU set to zeroes.
   * This way, we return uniform gray for the remainder of the segment.
   */
  if (! entropy->insufficient_data) {

    Se = cinfo->Se;
    Al = cinfo->Al;
    natural_order = cinfo->natural_order;

    /* Load up working state.
     * We can avoid loading/saving bitread state if in an EOB run.
     */
    EOBRUN = entropy->saved.EOBRUN;	/* only part of saved state we need */

    /* There is always only one block per MCU */

    if (EOBRUN > 0)		/* if it's a band of zeroes... */
      EOBRUN--;			/* ...process it now (we do nothing) */
    else {
      BITREAD_LOAD_STATE(cinfo,entropy->bitstate);
      block = MCU_data[0];
      tbl = entropy->ac_derived_tbl;

      for (k = cinfo->Ss; k <= Se; k++) {
	HUFF_DECODE(s, br_state, tbl, return FALSE, label2);
	r = s >> 4;
	s &= 15;
	if (s) {
	  k += r;
	  CHECK_BIT_BUFFER(br_state, s, return FALSE);
	  r = GET_BITS(s);
	  s = HUFF_EXTEND(r, s);
	  /* Scale and output coefficient in natural (dezigzagged) order */
	  (*block)[natural_order[k]] = (JCOEF) (s << Al);
	} else {
	  if (r == 15) {	/* ZRL */
	    k += 15;		/* skip 15 zeroes in band */
	  } else {		/* EOBr, run length is 2^r + appended bits */
	    EOBRUN = 1 << r;
	    if (r) {		/* EOBr, r > 0 */
	      CHECK_BIT_BUFFER(br_state, r, return FALSE);
	      r = GET_BITS(r);
	      EOBRUN += r;
	    }
	    EOBRUN--;		/* this band is processed at this moment */
	    break;		/* force end-of-band */
	  }
	}
      }

      BITREAD_SAVE_STATE(cinfo,entropy->bitstate);
    }

    /* Completed MCU, so update state */
    entropy->saved.EOBRUN = EOBRUN;	/* only part of saved state we need */
  }

  /* Account for restart interval (no-op if not using restarts) */
  entropy->restarts_to_go--;

  return TRUE;
}